

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

expected<const_Command::Arg_*,_Commands::MatchFailure> *
match_arg(expected<const_Command::Arg_*,_Commands::MatchFailure> *__return_storage_ptr__,
         Commands *commands,shared_ptr<const_SyntaxTree> *hint,float arg,Arg *arginfo,
         SymTable *symtable,shared_ptr<Scope> *scope_ptr,Options *options)

{
  Arg *local_88 [3];
  MatchFailure local_70;
  unexpected_type<Commands::MatchFailure> local_58;
  shared_ptr<Scope> *local_40;
  shared_ptr<Scope> *scope_ptr_local;
  SymTable *symtable_local;
  Arg *arginfo_local;
  shared_ptr<const_SyntaxTree> *psStack_20;
  float arg_local;
  shared_ptr<const_SyntaxTree> *hint_local;
  Commands *commands_local;
  
  local_40 = scope_ptr;
  scope_ptr_local = (shared_ptr<Scope> *)symtable;
  symtable_local = (SymTable *)arginfo;
  arginfo_local._4_4_ = arg;
  psStack_20 = hint;
  hint_local = (shared_ptr<const_SyntaxTree> *)commands;
  commands_local = (Commands *)__return_storage_ptr__;
  if ((*(ushort *)&arginfo->field_0x1 >> 3 & 1) == 0) {
    std::shared_ptr<const_SyntaxTree>::shared_ptr(&local_70.context,hint);
    local_70.reason = LiteralValueDisallowed;
    nonstd::make_unexpected<Commands::MatchFailure>(&local_58,&local_70);
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,&local_58);
    nonstd::unexpected_type<Commands::MatchFailure>::~unexpected_type(&local_58);
    Commands::MatchFailure::~MatchFailure(&local_70);
  }
  else if ((arginfo->type == Float) || (arginfo->type == Param)) {
    local_88[0] = arginfo;
    nonstd::expected<const_Command::Arg_*,_Commands::MatchFailure>::expected<true,_0>
              (__return_storage_ptr__,local_88);
  }
  else {
    make_expected_error(__return_storage_ptr__,hint,arginfo);
  }
  return __return_storage_ptr__;
}

Assistant:

static auto match_arg(const Commands& commands, const shared_ptr<const SyntaxTree>& hint,
                      float arg, const Command::Arg& arginfo, const SymTable& symtable,
                      const shared_ptr<Scope>& scope_ptr, const Options& options) -> expected<const Command::Arg*, MatchFailure>
{
    if(!arginfo.allow_constant)
        return make_unexpected(MatchFailure{ hint, MatchFailure::LiteralValueDisallowed });
    if(arginfo.type == ArgType::Float || arginfo.type == ArgType::Param)
        return &arginfo;
    return make_expected_error(hint, arginfo);
}